

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O0

void golf_graphics_begin_frame(float dt)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ImGuiIO *pIVar3;
  undefined1 local_7c [8];
  sg_pass_action action;
  float dt_local;
  
  pIVar3 = igGetIO();
  graphics.framerate = pIVar3->Framerate;
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  graphics.window_size = vec2_create((float)wVar1,(float)wVar2);
  action._96_8_ = graphics.window_size;
  memset(local_7c,0,0x68);
  local_7c._4_4_ = SG_ACTION_CLEAR;
  action.colors[0].value.g = 1.0;
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  sg_begin_default_pass((sg_pass_action *)local_7c,wVar1,wVar2);
  sg_end_pass();
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  simgui_new_frame(wVar1,wVar2,(double)dt);
  return;
}

Assistant:

void golf_graphics_begin_frame(float dt) {
    graphics.framerate = igGetIO()->Framerate;
    graphics.window_size = V2((float)sapp_width(), (float)sapp_height());

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0.0f, 0.0f, 0.0f, 1.0f },
        },
    };
    sg_begin_default_pass(&action, sapp_width(), sapp_height());
    sg_end_pass();
    simgui_new_frame(sapp_width(), sapp_height(), dt);
}